

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O2

pair<const_phmap::priv::NonStandardLayout,_int> * __thiscall
phmap::priv::hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::
operator()(pair<const_phmap::priv::NonStandardLayout,_int> *__return_storage_ptr__,
          Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *this)

{
  int iVar1;
  Generator<int,_void> local_3a;
  Generator<phmap::priv::NonStandardLayout,_void> local_39;
  NonStandardLayout local_38;
  
  Generator<phmap::priv::NonStandardLayout,_void>::operator()(&local_38,&local_39);
  iVar1 = Generator<int,_void>::operator()(&local_3a);
  NonStandardLayout::NonStandardLayout(&__return_storage_ptr__->first,&local_38);
  __return_storage_ptr__->second = iVar1;
  NonStandardLayout::~NonStandardLayout(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::pair<K, V> operator()() const {
        return std::pair<K, V>(Generator<typename std::decay<K>::type>()(),
                               Generator<typename std::decay<V>::type>()());
    }